

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValueToString
          (Printer *this,Message *message,FieldDescriptor *field,int index,string *output)

{
  Reflection *reflection;
  TextGenerator generator;
  StringOutputStream output_stream;
  TextGenerator local_68;
  StringOutputStream local_40;
  
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream(&local_40,output);
  local_68.indent_level_ = this->initial_indent_level_;
  local_68.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__TextGenerator_006819a0;
  local_68.buffer_ = (char *)0x0;
  local_68.buffer_size_ = 0;
  local_68.at_start_of_line_ = true;
  local_68.failed_ = false;
  local_68.output_ = &local_40.super_ZeroCopyOutputStream;
  local_68.initial_indent_level_ = local_68.indent_level_;
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  PrintFieldValue(this,message,reflection,field,index,&local_68);
  local_68.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__TextGenerator_006819a0;
  if ((local_68.failed_ == false) && (0 < local_68.buffer_size_)) {
    (*((ZeroCopyOutputStream *)&(local_68.output_)->_vptr_ZeroCopyOutputStream)->
      _vptr_ZeroCopyOutputStream[3])();
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValueToString(const Message& message,
                                                  const FieldDescriptor* field,
                                                  int index,
                                                  std::string* output) const {
  GOOGLE_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);
  TextGenerator generator(&output_stream, initial_indent_level_);

  PrintFieldValue(message, message.GetReflection(), field, index, &generator);
}